

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

void write_fifo(gba_apu_t *apu,int channel,uint32_t value,uint32_t mask)

{
  ulong uVar1;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  long lVar2;
  long in_RDI;
  uint8_t bmask;
  uint8_t sample;
  int b;
  int size;
  int local_1c;
  
  if ((*(byte *)(in_RDI + 0x4090) & 1) != 0) {
    if (1 < in_ESI) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/audio/audio.c",
              0x55);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","tried to fill FIFO >1");
      exit(1);
    }
    if ((int)*(undefined8 *)(in_RDI + (long)in_ESI * 0x38 + 0x28) -
        (int)*(undefined8 *)(in_RDI + (long)in_ESI * 0x38 + 0x20) < 0x1d) {
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        if ((char)(in_ECX >> ((byte)(local_1c << 3) & 0x1f)) == -1) {
          lVar2 = in_RDI + (long)in_ESI * 0x38;
          uVar1 = *(ulong *)(lVar2 + 0x28);
          *(ulong *)(lVar2 + 0x28) = uVar1 + 1;
          *(char *)(in_RDI + (long)in_ESI * 0x38 + (uVar1 & 0x1f)) =
               (char)(in_EDX >> ((byte)(local_1c << 3) & 0x1f));
        }
      }
    }
  }
  return;
}

Assistant:

void write_fifo(gba_apu_t* apu, int channel, word value, word mask) {
#ifdef ENABLE_AUDIO
    if (!apu->enable_audio) {
        return;
    }
    unimplemented(channel > 1, "tried to fill FIFO >1")
    int size = apu->fifo[channel].write_index - apu->fifo[channel].read_index;
    if (size <= 28) {
        for (int b = 0; b < 4; b++) {
            byte sample = (value >> (b * 8)) & 0xFF;
            byte bmask = (mask >> (b * 8)) & 0xFF;
            if (bmask == 0xFF) {
                apu->fifo[channel].buf[(apu->fifo[channel].write_index++) % SOUND_FIFO_SIZE] = sample;
            }
        }
    }
#endif
}